

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

int quorem(Bigint *b,Bigint *S)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint32 *puVar8;
  uint32 *puVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint32 *puVar13;
  uint32 *puVar14;
  ulong uVar15;
  uint32 *puVar16;
  
  lVar7 = (long)S->wds;
  iVar6 = 0;
  if (S->wds <= b->wds) {
    puVar16 = S->x;
    uVar15 = lVar7 - 1;
    puVar13 = S->x + lVar7 + -1;
    puVar14 = b->x;
    uVar2 = (ulong)b->x[lVar7 + -1] / (ulong)(*puVar13 + 1);
    iVar6 = (int)uVar2;
    if (*puVar13 + 1 <= b->x[lVar7 + -1]) {
      lVar5 = lVar7 * 4 + 0x14;
      lVar4 = 0;
      uVar10 = 0;
      puVar8 = puVar14;
      puVar9 = puVar16;
      do {
        uVar1 = *puVar9;
        puVar9 = puVar9 + 1;
        uVar11 = uVar1 * uVar2 + uVar10;
        uVar10 = uVar11 >> 0x20;
        lVar12 = ((ulong)*puVar8 - (uVar11 & 0xffffffff)) + lVar4;
        lVar4 = lVar12 >> 0x20;
        *puVar8 = (uint)lVar12;
        puVar8 = puVar8 + 1;
      } while (puVar9 <= puVar13);
      if (b->x[lVar7 + -1] == 0) {
        for (; (0x1c < lVar5 && (*(int *)((long)b->x + lVar5 + -0x1c) == 0)); lVar5 = lVar5 + -4) {
          uVar15 = (ulong)((int)uVar15 - 1);
        }
        b->wds = (int)uVar15;
      }
    }
    iVar3 = cmp(b,S);
    if (-1 < iVar3) {
      lVar7 = 0;
      do {
        uVar1 = *puVar16;
        puVar16 = puVar16 + 1;
        lVar5 = ((ulong)*puVar14 - (ulong)uVar1) + lVar7;
        lVar7 = lVar5 >> 0x20;
        *puVar14 = (uint)lVar5;
        puVar14 = puVar14 + 1;
      } while (puVar16 <= puVar13);
      iVar6 = iVar6 + 1;
      if (b->x[(int)uVar15] == 0) {
        for (lVar7 = (long)(int)uVar15 * 4 + 0x18;
            (0x1c < lVar7 && (*(int *)((long)b->x + lVar7 + -0x1c) == 0)); lVar7 = lVar7 + -4) {
          uVar15 = (ulong)((int)uVar15 - 1);
        }
        b->wds = (int)uVar15;
      }
    }
  }
  return iVar6;
}

Assistant:

static int
quorem(Bigint *b, Bigint *S)
{
    int n;
    ULong *bx, *bxe, q, *sx, *sxe;
#ifdef ULLong
    ULLong borrow, carry, y, ys;
#else
    ULong borrow, carry, y, ys;
    ULong si, z, zs;
#endif

    n = S->wds;
#ifdef DEBUG
    /*debug*/ if (b->wds > n)
        /*debug*/       Bug("oversize b in quorem");
#endif
    if (b->wds < n)
        return 0;
    sx = S->x;
    sxe = sx + --n;
    bx = b->x;
    bxe = bx + n;
    q = *bxe / (*sxe + 1);      /* ensure q <= true quotient */
#ifdef DEBUG
    /*debug*/ if (q > 9)
        /*debug*/       Bug("oversized quotient in quorem");
#endif
    if (q) {
        borrow = 0;
        carry = 0;
        do {
#ifdef ULLong
            ys = *sx++ * (ULLong)q + carry;
            carry = ys >> 32;
            y = *bx - (ys & FFFFFFFF) - borrow;
            borrow = y >> 32 & (ULong)1;
            *bx++ = (ULong)(y & FFFFFFFF);
#else
            si = *sx++;
            ys = (si & 0xffff) * q + carry;
            zs = (si >> 16) * q + (ys >> 16);
            carry = zs >> 16;
            y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
            borrow = (y & 0x10000) >> 16;
            z = (*bx >> 16) - (zs & 0xffff) - borrow;
            borrow = (z & 0x10000) >> 16;
            Storeinc(bx, z, y);
#endif
        }
        while(sx <= sxe);
        if (!*bxe) {
            bx = b->x;
            while(--bxe > bx && !*bxe)
                --n;
            b->wds = n;
        }
    }
    if (cmp(b, S) >= 0) {
        q++;
        borrow = 0;
        carry = 0;
        bx = b->x;
        sx = S->x;
        do {
#ifdef ULLong
            ys = *sx++ + carry;
            carry = ys >> 32;
            y = *bx - (ys & FFFFFFFF) - borrow;
            borrow = y >> 32 & (ULong)1;
            *bx++ = (ULong)(y & FFFFFFFF);
#else
            si = *sx++;
            ys = (si & 0xffff) + carry;
            zs = (si >> 16) + (ys >> 16);
            carry = zs >> 16;
            y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
            borrow = (y & 0x10000) >> 16;
            z = (*bx >> 16) - (zs & 0xffff) - borrow;
            borrow = (z & 0x10000) >> 16;
            Storeinc(bx, z, y);
#endif
        }
        while(sx <= sxe);
        bx = b->x;
        bxe = bx + n;
        if (!*bxe) {
            while(--bxe > bx && !*bxe)
                --n;
            b->wds = n;
        }
    }
    return q;
}